

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1f2fe16::Impl::registerHandler
          (Impl *this,TypeInfo *typeinfo,GenericEventHandler *handler)

{
  GenericEventHandler *handler_local;
  TypeInfo *typeinfo_local;
  Impl *this_local;
  
  EventHandlers::put(&this->handlers,typeinfo,handler);
  return;
}

Assistant:

void registerHandler(const dap::TypeInfo* typeinfo,
                       const GenericEventHandler& handler) override {
    handlers.put(typeinfo, handler);
  }